

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_generator.cc
# Opt level: O0

complex<float> anon_unknown.dwarf_7270e::I0(complex<float> x)

{
  complex<float> cVar1;
  float local_98;
  complex<float> local_94;
  float local_8c;
  complex<float> local_88;
  complex<float> local_80;
  float local_78;
  complex<float> local_74;
  complex<float> local_6c;
  float local_64;
  complex<float> local_60;
  complex<float> local_58;
  float local_50;
  complex<float> local_4c;
  complex<float> local_44;
  float local_3c;
  complex<float> local_38;
  complex<float> local_30;
  float local_28;
  float local_24;
  complex<float> local_20;
  complex<float> y;
  complex<float> x_local;
  
  local_24 = 3.75;
  std::operator/(&y,&local_24);
  std::complex<float>::operator*=(&local_20,&local_20);
  local_28 = 1.0;
  local_3c = 3.5156229;
  local_50 = 3.0899425;
  local_64 = 1.2067492;
  local_78 = 0.2659732;
  local_8c = 0.0360768;
  local_98 = 0.0045813;
  std::operator*(&local_20,&local_98);
  std::operator+(&local_8c,&local_94);
  std::operator*(&local_20,&local_88);
  std::operator+(&local_78,&local_80);
  std::operator*(&local_20,&local_74);
  std::operator+(&local_64,&local_6c);
  std::operator*(&local_20,&local_60);
  std::operator+(&local_50,&local_58);
  std::operator*(&local_20,&local_4c);
  std::operator+(&local_3c,&local_44);
  std::operator*(&local_20,&local_38);
  cVar1 = std::operator+(&local_28,&local_30);
  return (complex<float>)cVar1._M_value;
}

Assistant:

complex<float> I0(complex<float> x) {
  complex<float> y = x / 3.75f;
  y *= y;
  return 1.0f + y * (
    3.5156229f + y * (
      3.0899424f + y * (
        1.2067492f + y * (
          0.2659732f + y * (
            0.360768e-1f + y * 0.45813e-2f)))));
}